

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2vectors.c
# Opt level: O3

void test_v2vectors(void)

{
  uint8_t *message;
  char *pcVar1;
  char cVar2;
  int iVar3;
  FILE *pFVar4;
  char *pcVar5;
  long *plVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  long *plVar12;
  long *plVar13;
  undefined8 *puVar14;
  size_t footer_len;
  uint8_t *footer;
  size_t dec_len;
  uint8_t nonce [24];
  uint8_t key [32];
  size_t sStack_920;
  char *pcStack_918;
  undefined1 auStack_910 [32];
  undefined1 auStack_8f0 [64];
  char cStack_8b0;
  undefined7 uStack_8af;
  size_t local_470;
  char *local_468;
  size_t local_460;
  uint8_t local_458 [32];
  char local_438 [1032];
  
  pFVar4 = fopen("test/v2vectors.csv","r");
  if (pFVar4 == (FILE *)0x0) {
    test_v2vectors_cold_3();
    cVar2 = paseto_v2_public_load_secret_key_hex
                      (auStack_8f0,
                       "b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a37741eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
                      );
    if (cVar2 == '\0') {
      __assert_fail("paseto_v2_public_load_secret_key_hex(secret_key, \"b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a3774\" \"1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2\" ) == true"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                    ,0x45,"void test_v2publicvectors(void)");
    }
    cVar2 = paseto_v2_public_load_public_key_hex
                      (auStack_910,
                       "1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2");
    if (cVar2 == '\0') {
      __assert_fail("paseto_v2_public_load_public_key_hex(public_key, \"1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2\" ) == true"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                    ,0x48,"void test_v2publicvectors(void)");
    }
    pFVar4 = fopen("test/v2publicvectors.csv","r");
    if (pFVar4 == (FILE *)0x0) {
      test_v2publicvectors_cold_3();
      halt_baddata();
    }
    puVar11 = (undefined8 *)0x0;
    puVar10 = (undefined8 *)0x0;
    while (puVar14 = puVar10, pcVar5 = fgets(&cStack_8b0,0x400,pFVar4), pcVar5 != (char *)0x0) {
      puVar10 = puVar14;
      if (cStack_8b0 != '#') {
        puVar10 = (undefined8 *)calloc(1,0x30);
        pcVar5 = strdup(&cStack_8b0);
        puVar10[1] = pcVar5;
        pcVar5 = strchr(pcVar5,0x3b);
        *pcVar5 = '\0';
        puVar10[2] = pcVar5 + 1;
        pcVar5 = strchr(pcVar5 + 1,0x3b);
        *pcVar5 = '\0';
        puVar10[3] = pcVar5 + 1;
        pcVar5 = strchr(pcVar5 + 1,0x3b);
        *pcVar5 = '\0';
        puVar10[4] = pcVar5 + 1;
        pcVar5 = strchr(pcVar5 + 1,0x3b);
        *pcVar5 = '\0';
        puVar10[5] = pcVar5 + 1;
        pcVar5 = strchr(pcVar5 + 1,10);
        *pcVar5 = '\0';
        if (puVar11 == (undefined8 *)0x0) {
          puVar11 = puVar10;
        }
        if (puVar14 != (undefined8 *)0x0) {
          *puVar14 = puVar10;
        }
      }
    }
    while( true ) {
      if (puVar11 == (undefined8 *)0x0) {
        return;
      }
      printf("Running test \'%s\'...",puVar11[1]);
      pcVar5 = (char *)puVar11[3];
      sVar7 = strlen(pcVar5);
      pcVar1 = (char *)puVar11[4];
      sVar8 = strlen(pcVar1);
      pcVar5 = (char *)paseto_v2_public_sign(pcVar5,sVar7,auStack_8f0,pcVar1,sVar8);
      if (pcVar5 == (char *)0x0) break;
      iVar3 = strcmp((char *)puVar11[5],pcVar5);
      if (iVar3 != 0) {
        __assert_fail("strcmp(case_->signed_message, enc) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,0x53,"void test_v2publicvectors(void)");
      }
      free(pcVar5);
      printf(" signing ok...");
      pvVar9 = (void *)paseto_v2_public_verify
                                 (puVar11[5],&cStack_8b0,auStack_910,&pcStack_918,&sStack_920);
      if (pvVar9 == (void *)0x0) goto LAB_001023d3;
      sVar7 = CONCAT71(uStack_8af,cStack_8b0);
      pcVar5 = (char *)puVar11[3];
      sVar8 = strlen(pcVar5);
      if (sVar7 != sVar8) {
        __assert_fail("dec_len == strlen(case_->message)",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,0x60,"void test_v2publicvectors(void)");
      }
      iVar3 = bcmp(pcVar5,pvVar9,sVar7);
      if (iVar3 != 0) {
        __assert_fail("memcmp(case_->message, dec, dec_len) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                      ,0x61,"void test_v2publicvectors(void)");
      }
      paseto_free(pvVar9);
      pcVar5 = (char *)puVar11[4];
      sVar7 = strlen(pcVar5);
      pcVar1 = pcStack_918;
      if (sVar7 == 0) {
        if (pcStack_918 != (char *)0x0) {
          __assert_fail("footer == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                        ,100,"void test_v2publicvectors(void)");
        }
        if (sStack_920 != 0) {
          __assert_fail("footer_len == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                        ,0x65,"void test_v2publicvectors(void)");
        }
      }
      else {
        if (pcStack_918 == (char *)0x0) {
          __assert_fail("footer != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                        ,0x67,"void test_v2publicvectors(void)");
        }
        if (sStack_920 != sVar7) goto LAB_001023d8;
        iVar3 = strcmp(pcVar5,pcStack_918);
        if (iVar3 != 0) {
          __assert_fail("strcmp(case_->footer, (const char *) footer) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                        ,0x69,"void test_v2publicvectors(void)");
        }
        paseto_free(pcVar1);
      }
      puts(" verifying ok");
      puVar11 = (undefined8 *)*puVar11;
    }
    test_v2publicvectors_cold_2();
LAB_001023d3:
    test_v2publicvectors_cold_1();
LAB_001023d8:
    __assert_fail("footer_len == strlen(case_->footer)",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                  ,0x68,"void test_v2publicvectors(void)");
  }
  plVar12 = (long *)0x0;
  plVar6 = (long *)0x0;
  while (plVar13 = plVar6, pcVar5 = fgets(local_438,0x400,pFVar4), pcVar5 != (char *)0x0) {
    plVar6 = plVar13;
    if (local_438[0] != '#') {
      plVar6 = (long *)calloc(1,0x38);
      pcVar5 = strdup(local_438);
      plVar6[1] = (long)pcVar5;
      pcVar5 = strchr(pcVar5,0x3b);
      *pcVar5 = '\0';
      plVar6[2] = (long)(pcVar5 + 1);
      pcVar5 = strchr(pcVar5 + 1,0x3b);
      *pcVar5 = '\0';
      plVar6[3] = (long)(pcVar5 + 1);
      pcVar5 = strchr(pcVar5 + 1,0x3b);
      *pcVar5 = '\0';
      plVar6[4] = (long)(pcVar5 + 1);
      pcVar5 = strchr(pcVar5 + 1,0x3b);
      *pcVar5 = '\0';
      plVar6[5] = (long)(pcVar5 + 1);
      pcVar5 = strchr(pcVar5 + 1,0x3b);
      *pcVar5 = '\0';
      plVar6[6] = (long)(pcVar5 + 1);
      pcVar5 = strchr(pcVar5 + 1,10);
      *pcVar5 = '\0';
      if (*(char *)plVar6[6] == '\0') {
        plVar6[6] = 0;
      }
      if (plVar12 == (long *)0x0) {
        plVar12 = plVar6;
      }
      if (plVar13 != (long *)0x0) {
        *plVar13 = (long)plVar6;
      }
    }
  }
  if (plVar12 != (long *)0x0) {
    do {
      printf("Running test \'%s\'...",plVar12[1]);
      nonce_load_hex(local_458,(char *)plVar12[6]);
      message = (uint8_t *)plVar12[3];
      sVar7 = strlen((char *)message);
      generate_reference_nonce(local_458,message,sVar7);
      nonce_override(local_458);
      cVar2 = paseto_v2_local_load_key_hex(local_438,plVar12[4]);
      if (cVar2 == '\0') {
        __assert_fail("paseto_v2_local_load_key_hex(key, case_->key) == true",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,0x4f,"void test_v2vectors(void)");
      }
      pcVar5 = (char *)plVar12[3];
      sVar7 = strlen(pcVar5);
      pcVar1 = (char *)plVar12[5];
      sVar8 = strlen(pcVar1);
      pcVar5 = (char *)paseto_v2_local_encrypt(pcVar5,sVar7,local_438,pcVar1,sVar8);
      if (pcVar5 == (char *)0x0) {
        test_v2vectors_cold_2();
LAB_00101fb7:
        test_v2vectors_cold_1();
LAB_00101fbc:
        __assert_fail("memcmp(case_->message, dec, dec_len) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,100,"void test_v2vectors(void)");
      }
      iVar3 = strcmp((char *)plVar12[2],pcVar5);
      if (iVar3 != 0) {
        __assert_fail("strcmp(case_->encrypted, enc) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,0x56,"void test_v2vectors(void)");
      }
      free(pcVar5);
      printf(" encryption ok...");
      pvVar9 = (void *)paseto_v2_local_decrypt
                                 (plVar12[2],&local_460,local_438,&local_468,&local_470);
      sVar7 = local_460;
      if (pvVar9 == (void *)0x0) goto LAB_00101fb7;
      pcVar5 = (char *)plVar12[3];
      sVar8 = strlen(pcVar5);
      if (sVar7 != sVar8) {
        __assert_fail("dec_len == strlen(case_->message)",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,99,"void test_v2vectors(void)");
      }
      iVar3 = bcmp(pcVar5,pvVar9,sVar7);
      if (iVar3 != 0) goto LAB_00101fbc;
      paseto_free(pvVar9);
      pcVar5 = (char *)plVar12[5];
      sVar7 = strlen(pcVar5);
      pcVar1 = local_468;
      if (sVar7 == 0) {
        if (local_468 != (char *)0x0) {
          __assert_fail("footer == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                        ,0x67,"void test_v2vectors(void)");
        }
        if (local_470 != 0) {
          __assert_fail("footer_len == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                        ,0x68,"void test_v2vectors(void)");
        }
      }
      else {
        if (local_468 == (char *)0x0) {
          __assert_fail("footer != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                        ,0x6a,"void test_v2vectors(void)");
        }
        if (local_470 != sVar7) {
          __assert_fail("footer_len == strlen(case_->footer)",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                        ,0x6b,"void test_v2vectors(void)");
        }
        iVar3 = strcmp(pcVar5,local_468);
        if (iVar3 != 0) {
          __assert_fail("strcmp(case_->footer, (const char *) footer) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                        ,0x6c,"void test_v2vectors(void)");
        }
        paseto_free(pcVar1);
      }
      puts(" decryption ok");
      plVar12 = (long *)*plVar12;
    } while (plVar12 != (long *)0x0);
  }
  return;
}

Assistant:

void test_v2vectors(void) {
    struct test_case *cases = load_csv();
    for (struct test_case *case_ = cases; case_; case_ = case_->next) {
        printf("Running test '%s'...", case_->name);
        uint8_t nonce[paseto_v2_LOCAL_NONCEBYTES];
        nonce_load_hex(nonce, case_->nonce);
        generate_reference_nonce(nonce,
                (const uint8_t *) case_->message,
                strlen(case_->message));
        nonce_override(nonce);
        uint8_t key[paseto_v2_LOCAL_KEYBYTES];
        assert(paseto_v2_local_load_key_hex(key, case_->key) == true);
        char *enc = paseto_v2_local_encrypt(
                (const uint8_t *) case_->message, strlen(case_->message),
                key,
                (const uint8_t *) case_->footer, strlen(case_->footer));
        if (!enc) perror("paseto_v2_local_encrypt failed");
        assert(enc != NULL);
        assert(strcmp(case_->encrypted, enc) == 0);
        free(enc);
        printf(" encryption ok...");

        size_t dec_len;
        uint8_t *footer;
        size_t footer_len;
        uint8_t *dec = paseto_v2_local_decrypt(
                case_->encrypted, &dec_len,
                key,
                &footer, &footer_len);
        if (!dec) perror("paseto_v2_local_decrypt failed");
        assert(dec != NULL);
        assert(dec_len == strlen(case_->message));
        assert(memcmp(case_->message, dec, dec_len) == 0);
        paseto_free(dec);
        if (strlen(case_->footer) == 0) {
            assert(footer == NULL);
            assert(footer_len == 0);
        } else {
            assert(footer != NULL);
            assert(footer_len == strlen(case_->footer));
            assert(strcmp(case_->footer, (const char *) footer) == 0);
            paseto_free(footer);
        }
        printf(" decryption ok\n");
    }
}